

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O2

string * __thiscall
nlohmann::json_uri::location_abi_cxx11_(string *__return_storage_ptr__,json_uri *this)

{
  ostream *poVar1;
  stringstream s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((this->urn_)._M_string_length == 0) {
    std::__cxx11::stringstream::stringstream(asStack_198);
    if ((this->scheme_)._M_string_length != 0) {
      poVar1 = std::operator<<(local_188,(string *)&this->scheme_);
      std::operator<<(poVar1,"://");
    }
    poVar1 = std::operator<<(local_188,(string *)&this->authority_);
    std::operator<<(poVar1,(string *)&this->path_);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_198);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string json_uri::location() const
{
	if (urn_.size())
		return urn_;

	std::stringstream s;

	if (scheme_.size() > 0)
		s << scheme_ << "://";

	s << authority_
	  << path_;

	return s.str();
}